

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::write_content_with_provider
          (Server *this,Stream *strm,Request *req,Response *res,string *boundary,
          string *content_type)

{
  bool bVar1;
  size_type sVar2;
  type compressor_00;
  pair<unsigned_long,_unsigned_long> pVar3;
  unique_ptr<httplib::detail::nocompressor,_std::default_delete<httplib::detail::nocompressor>_>
  local_80;
  unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
  local_78;
  unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
  compressor;
  EncodingType type;
  unsigned_long length;
  unsigned_long offset;
  pair<unsigned_long,_unsigned_long> offsets;
  anon_class_8_1_8991fb9c is_shutting_down;
  string *content_type_local;
  string *boundary_local;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  Server *this_local;
  
  offsets.second = (unsigned_long)this;
  if (res->content_length_ == 0) {
    if ((res->is_chunked_content_provider_ & 1U) == 0) {
      this_local._7_1_ =
           detail::
           write_content_without_length<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                     (strm,&res->content_provider_,(anon_class_8_1_8991fb9c *)&offsets.second);
    }
    else {
      compressor._M_t.
      super___uniq_ptr_impl<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
      ._M_t.
      super__Tuple_impl<0UL,_httplib::detail::compressor_*,_std::default_delete<httplib::detail::compressor>_>
      .super__Head_base<0UL,_httplib::detail::compressor_*,_false>._M_head_impl._4_4_ =
           detail::encoding_type(req,res);
      std::unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>
      ::unique_ptr<std::default_delete<httplib::detail::compressor>,void>
                ((unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>
                  *)&local_78);
      if ((compressor._M_t.
           super___uniq_ptr_impl<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
           ._M_t.
           super__Tuple_impl<0UL,_httplib::detail::compressor_*,_std::default_delete<httplib::detail::compressor>_>
           .super__Head_base<0UL,_httplib::detail::compressor_*,_false>._M_head_impl._4_4_ != Gzip)
         && (compressor._M_t.
             super___uniq_ptr_impl<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
             ._M_t.
             super__Tuple_impl<0UL,_httplib::detail::compressor_*,_std::default_delete<httplib::detail::compressor>_>
             .super__Head_base<0UL,_httplib::detail::compressor_*,_false>._M_head_impl._4_4_ !=
             Brotli)) {
        detail::make_unique<httplib::detail::nocompressor>();
        std::
        unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>::
        operator=((unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>
                   *)&local_78,&local_80);
        std::
        unique_ptr<httplib::detail::nocompressor,_std::default_delete<httplib::detail::nocompressor>_>
        ::~unique_ptr(&local_80);
      }
      bVar1 = std::operator!=(&local_78,(nullptr_t)0x0);
      if (!bVar1) {
        __assert_fail("compressor != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h"
                      ,0x11bd,
                      "bool httplib::Server::write_content_with_provider(Stream &, const Request &, Response &, const std::string &, const std::string &)"
                     );
      }
      compressor_00 =
           std::
           unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
           ::operator*(&local_78);
      this_local._7_1_ =
           detail::
           write_content_chunked<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_,httplib::detail::compressor>
                     (strm,&res->content_provider_,(anon_class_8_1_8991fb9c *)&offsets.second,
                      compressor_00);
      std::
      unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>::
      ~unique_ptr(&local_78);
    }
  }
  else {
    bVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::empty
                      (&req->ranges);
    if (bVar1) {
      this_local._7_1_ =
           detail::
           write_content<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                     (strm,&res->content_provider_,0,res->content_length_,
                      (anon_class_8_1_8991fb9c *)&offsets.second);
    }
    else {
      sVar2 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                        (&req->ranges);
      if (sVar2 == 1) {
        pVar3 = detail::get_range_offset_and_length(req,res->content_length_,0);
        offset = pVar3.first;
        offsets.first = pVar3.second;
        this_local._7_1_ =
             detail::
             write_content<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                       (strm,&res->content_provider_,offset,offsets.first,
                        (anon_class_8_1_8991fb9c *)&offsets.second);
      }
      else {
        this_local._7_1_ =
             detail::
             write_multipart_ranges_data<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                       (strm,req,res,boundary,content_type,
                        (anon_class_8_1_8991fb9c *)&offsets.second);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool
	Server::write_content_with_provider(Stream &strm, const Request &req,
										Response &res, const std::string &boundary,
										const std::string &content_type) {
		auto is_shutting_down = [this]() {
			return this->svr_sock_ == INVALID_SOCKET;
		};

		if (res.content_length_ > 0) {
			if (req.ranges.empty()) {
				return detail::write_content(strm, res.content_provider_, 0,
											 res.content_length_, is_shutting_down);
			} else if (req.ranges.size() == 1) {
				auto offsets =
						detail::get_range_offset_and_length(req, res.content_length_, 0);
				auto offset = offsets.first;
				auto length = offsets.second;
				return detail::write_content(strm, res.content_provider_, offset, length,
											 is_shutting_down);
			} else {
				return detail::write_multipart_ranges_data(
						strm, req, res, boundary, content_type, is_shutting_down);
			}
		} else {
			if (res.is_chunked_content_provider_) {
				auto type = detail::encoding_type(req, res);

				std::unique_ptr<detail::compressor> compressor;
				if (type == detail::EncodingType::Gzip) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
					compressor = detail::make_unique<detail::gzip_compressor>();
#endif
				} else if (type == detail::EncodingType::Brotli) {
#ifdef CPPHTTPLIB_BROTLI_SUPPORT
					compressor = detail::make_unique<detail::brotli_compressor>();
#endif
				} else {
					compressor = detail::make_unique<detail::nocompressor>();
				}
				assert(compressor != nullptr);

				return detail::write_content_chunked(strm, res.content_provider_,
													 is_shutting_down, *compressor);
			} else {
				return detail::write_content_without_length(strm, res.content_provider_,
															is_shutting_down);
			}
		}
	}